

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::BNLL_x86_fma::forward_inplace(BNLL_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [32];
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  long lVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar19 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar34 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar78 = ZEXT3264(CONCAT428(0x3f000000,
                                 CONCAT424(0x3f000000,
                                           CONCAT420(0x3f000000,
                                                     CONCAT416(0x3f000000,
                                                               CONCAT412(0x3f000000,
                                                                         CONCAT48(0x3f000000,
                                                                                  0x3f0000003f000000
                                                                                 )))))));
    auVar79 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                 CONCAT424(0x3fb8aa3b,
                                           CONCAT420(0x3fb8aa3b,
                                                     CONCAT416(0x3fb8aa3b,
                                                               CONCAT412(0x3fb8aa3b,
                                                                         CONCAT48(0x3fb8aa3b,
                                                                                  0x3fb8aa3b3fb8aa3b
                                                                                 )))))));
    auVar80 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar81 = ZEXT3264(CONCAT428(0x3f318000,
                                 CONCAT424(0x3f318000,
                                           CONCAT420(0x3f318000,
                                                     CONCAT416(0x3f318000,
                                                               CONCAT412(0x3f318000,
                                                                         CONCAT48(0x3f318000,
                                                                                  0x3f3180003f318000
                                                                                 )))))));
    auVar82 = ZEXT3264(CONCAT428(0xb95e8083,
                                 CONCAT424(0xb95e8083,
                                           CONCAT420(0xb95e8083,
                                                     CONCAT416(0xb95e8083,
                                                               CONCAT412(0xb95e8083,
                                                                         CONCAT48(0xb95e8083,
                                                                                  0xb95e8083b95e8083
                                                                                 )))))));
    do {
      auVar77._8_4_ = 0xc2b0c0a5;
      auVar77._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar77._12_4_ = 0xc2b0c0a5;
      auVar77._16_4_ = 0xc2b0c0a5;
      auVar77._20_4_ = 0xc2b0c0a5;
      auVar77._24_4_ = 0xc2b0c0a5;
      auVar77._28_4_ = 0xc2b0c0a5;
      pauVar8 = (undefined1 (*) [32])
                (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar6 < 8) {
        uVar4 = 0;
      }
      else {
        iVar3 = 7;
        auVar15._8_4_ = 0xffffff81;
        auVar15._0_8_ = 0xffffff81ffffff81;
        auVar15._12_4_ = 0xffffff81;
        do {
          auVar16._8_4_ = 0x80000000;
          auVar16._0_8_ = 0x8000000080000000;
          auVar16._12_4_ = 0x80000000;
          auVar16._16_4_ = 0x80000000;
          auVar16._20_4_ = 0x80000000;
          auVar16._24_4_ = 0x80000000;
          auVar16._28_4_ = 0x80000000;
          auVar16 = vorps_avx(*pauVar8,auVar16);
          auVar25._8_4_ = 0x42b0c0a5;
          auVar25._0_8_ = 0x42b0c0a542b0c0a5;
          auVar25._12_4_ = 0x42b0c0a5;
          auVar25._16_4_ = 0x42b0c0a5;
          auVar25._20_4_ = 0x42b0c0a5;
          auVar25._24_4_ = 0x42b0c0a5;
          auVar25._28_4_ = 0x42b0c0a5;
          auVar16 = vminps_avx(auVar16,auVar25);
          auVar2 = vmaxps_avx(auVar77,auVar16);
          auVar25 = auVar78._0_32_;
          auVar12 = vfmadd213ps_fma(auVar79._0_32_,auVar2,auVar25);
          auVar18 = vroundps_avx(ZEXT1632(auVar12),1);
          auVar16 = vcmpps_avx(ZEXT1632(auVar12),auVar18,1);
          auVar16 = vandps_avx(auVar80._0_32_,auVar16);
          auVar16 = vsubps_avx(auVar18,auVar16);
          auVar12 = vfmsub231ps_fma(auVar2,auVar16,auVar81._0_32_);
          auVar19 = vfnmsub231ps_fma(ZEXT1632(auVar12),auVar16,auVar82._0_32_);
          auVar17 = ZEXT1632(auVar19);
          auVar2._28_4_ = auVar18._28_4_;
          auVar2._0_28_ =
               ZEXT1628(CONCAT412(auVar19._12_4_ * auVar19._12_4_,
                                  CONCAT48(auVar19._8_4_ * auVar19._8_4_,
                                           CONCAT44(auVar19._4_4_ * auVar19._4_4_,
                                                    auVar19._0_4_ * auVar19._0_4_))));
          auVar41._8_4_ = 0x39506967;
          auVar41._0_8_ = 0x3950696739506967;
          auVar41._12_4_ = 0x39506967;
          auVar41._16_4_ = 0x39506967;
          auVar41._20_4_ = 0x39506967;
          auVar41._24_4_ = 0x39506967;
          auVar41._28_4_ = 0x39506967;
          auVar49._8_4_ = 0x3ab743ce;
          auVar49._0_8_ = 0x3ab743ce3ab743ce;
          auVar49._12_4_ = 0x3ab743ce;
          auVar49._16_4_ = 0x3ab743ce;
          auVar49._20_4_ = 0x3ab743ce;
          auVar49._24_4_ = 0x3ab743ce;
          auVar49._28_4_ = 0x3ab743ce;
          auVar12 = vfmadd213ps_fma(auVar41,auVar17,auVar49);
          auVar50._8_4_ = 0x3c088908;
          auVar50._0_8_ = 0x3c0889083c088908;
          auVar50._12_4_ = 0x3c088908;
          auVar50._16_4_ = 0x3c088908;
          auVar50._20_4_ = 0x3c088908;
          auVar50._24_4_ = 0x3c088908;
          auVar50._28_4_ = 0x3c088908;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar17,auVar50);
          auVar51._8_4_ = 0x3d2aa9c1;
          auVar51._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar51._12_4_ = 0x3d2aa9c1;
          auVar51._16_4_ = 0x3d2aa9c1;
          auVar51._20_4_ = 0x3d2aa9c1;
          auVar51._24_4_ = 0x3d2aa9c1;
          auVar51._28_4_ = 0x3d2aa9c1;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar17,auVar51);
          auVar52._8_4_ = 0x3e2aaaaa;
          auVar52._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar52._12_4_ = 0x3e2aaaaa;
          auVar52._16_4_ = 0x3e2aaaaa;
          auVar52._20_4_ = 0x3e2aaaaa;
          auVar52._24_4_ = 0x3e2aaaaa;
          auVar52._28_4_ = 0x3e2aaaaa;
          auVar18 = ZEXT1632(auVar19);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar18,auVar52);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar18,auVar25);
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar2,auVar18);
          auVar31._0_4_ = auVar80._0_4_ + auVar12._0_4_;
          auVar31._4_4_ = auVar80._4_4_ + auVar12._4_4_;
          auVar31._8_4_ = auVar80._8_4_ + auVar12._8_4_;
          auVar31._12_4_ = auVar80._12_4_ + auVar12._12_4_;
          auVar31._16_4_ = auVar80._16_4_ + 0.0;
          auVar31._20_4_ = auVar80._20_4_ + 0.0;
          auVar31._24_4_ = auVar80._24_4_ + 0.0;
          auVar31._28_4_ = auVar80._28_4_ + 0.0;
          auVar12._0_4_ = (int)auVar16._0_4_;
          auVar12._4_4_ = (int)auVar16._4_4_;
          auVar12._8_4_ = (int)auVar16._8_4_;
          auVar12._12_4_ = (int)auVar16._12_4_;
          auVar18._16_4_ = (int)auVar16._16_4_;
          auVar18._0_16_ = auVar12;
          auVar18._20_4_ = (int)auVar16._20_4_;
          auVar18._24_4_ = (int)auVar16._24_4_;
          auVar18._28_4_ = (int)auVar16._28_4_;
          auVar19 = vpslld_avx(auVar12,0x17);
          auVar12 = vpslld_avx(auVar18._16_16_,0x17);
          auVar34._8_4_ = 0x3f800000;
          auVar34._0_8_ = 0x3f8000003f800000;
          auVar34._12_4_ = 0x3f800000;
          auVar12 = vpaddd_avx(auVar12,auVar34);
          auVar19 = vpaddd_avx(auVar19,auVar34);
          auVar17._16_16_ = auVar12;
          auVar17._0_16_ = auVar19;
          auVar34 = vfmadd213ps_fma(auVar17,auVar31,auVar80._0_32_);
          auVar26._8_4_ = 0x800000;
          auVar26._0_8_ = 0x80000000800000;
          auVar26._12_4_ = 0x800000;
          auVar26._16_4_ = 0x800000;
          auVar26._20_4_ = 0x800000;
          auVar26._24_4_ = 0x800000;
          auVar26._28_4_ = 0x800000;
          auVar16 = vmaxps_avx(ZEXT1632(auVar34),auVar26);
          auVar19 = vpsrld_avx(auVar16._0_16_,0x17);
          auVar12 = vpsrld_avx(auVar16._16_16_,0x17);
          auVar53._8_4_ = 0x807fffff;
          auVar53._0_8_ = 0x807fffff807fffff;
          auVar53._12_4_ = 0x807fffff;
          auVar53._16_4_ = 0x807fffff;
          auVar53._20_4_ = 0x807fffff;
          auVar53._24_4_ = 0x807fffff;
          auVar53._28_4_ = 0x807fffff;
          auVar16 = vandps_avx(auVar16,auVar53);
          auVar18 = vorps_avx(auVar25,auVar16);
          auVar54._8_4_ = 0x3f3504f3;
          auVar54._0_8_ = 0x3f3504f33f3504f3;
          auVar54._12_4_ = 0x3f3504f3;
          auVar54._16_4_ = 0x3f3504f3;
          auVar54._20_4_ = 0x3f3504f3;
          auVar54._24_4_ = 0x3f3504f3;
          auVar54._28_4_ = 0x3f3504f3;
          auVar2 = vcmpps_avx(auVar54,auVar18,2);
          auVar16 = vandnps_avx(auVar2,auVar18);
          auVar79 = ZEXT3264(auVar79._0_32_);
          auVar27._0_4_ = auVar18._0_4_ + -1.0 + auVar16._0_4_;
          auVar27._4_4_ = auVar18._4_4_ + -1.0 + auVar16._4_4_;
          auVar27._8_4_ = auVar18._8_4_ + -1.0 + auVar16._8_4_;
          auVar27._12_4_ = auVar18._12_4_ + -1.0 + auVar16._12_4_;
          auVar27._16_4_ = auVar18._16_4_ + -1.0 + auVar16._16_4_;
          auVar27._20_4_ = auVar18._20_4_ + -1.0 + auVar16._20_4_;
          auVar27._24_4_ = auVar18._24_4_ + -1.0 + auVar16._24_4_;
          auVar27._28_4_ = auVar18._28_4_ + -1.0 + auVar16._28_4_;
          auVar12 = vpsubd_avx(auVar12,auVar2._16_16_);
          auVar12 = vpaddd_avx(auVar15,auVar12);
          auVar19 = vpsubd_avx(auVar19,auVar2._0_16_);
          auVar19 = vpaddd_avx(auVar15,auVar19);
          auVar32._16_16_ = auVar12;
          auVar32._0_16_ = auVar19;
          auVar42._0_4_ = auVar27._0_4_ * auVar27._0_4_;
          auVar42._4_4_ = auVar27._4_4_ * auVar27._4_4_;
          auVar42._8_4_ = auVar27._8_4_ * auVar27._8_4_;
          auVar42._12_4_ = auVar27._12_4_ * auVar27._12_4_;
          auVar42._16_4_ = auVar27._16_4_ * auVar27._16_4_;
          auVar42._20_4_ = auVar27._20_4_ * auVar27._20_4_;
          auVar42._24_4_ = auVar27._24_4_ * auVar27._24_4_;
          auVar42._28_4_ = 0;
          auVar55._8_4_ = 0x3d9021bb;
          auVar55._0_8_ = 0x3d9021bb3d9021bb;
          auVar55._12_4_ = 0x3d9021bb;
          auVar55._16_4_ = 0x3d9021bb;
          auVar55._20_4_ = 0x3d9021bb;
          auVar55._24_4_ = 0x3d9021bb;
          auVar55._28_4_ = 0x3d9021bb;
          auVar65._8_4_ = 0xbdebd1b8;
          auVar65._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar65._12_4_ = 0xbdebd1b8;
          auVar65._16_4_ = 0xbdebd1b8;
          auVar65._20_4_ = 0xbdebd1b8;
          auVar65._24_4_ = 0xbdebd1b8;
          auVar65._28_4_ = 0xbdebd1b8;
          auVar12 = vfmadd213ps_fma(auVar55,auVar27,auVar65);
          auVar66._8_4_ = 0x3def251a;
          auVar66._0_8_ = 0x3def251a3def251a;
          auVar66._12_4_ = 0x3def251a;
          auVar66._16_4_ = 0x3def251a;
          auVar66._20_4_ = 0x3def251a;
          auVar66._24_4_ = 0x3def251a;
          auVar66._28_4_ = 0x3def251a;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar27,auVar66);
          auVar67._8_4_ = 0xbdfe5d4f;
          auVar67._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar67._12_4_ = 0xbdfe5d4f;
          auVar67._16_4_ = 0xbdfe5d4f;
          auVar67._20_4_ = 0xbdfe5d4f;
          auVar67._24_4_ = 0xbdfe5d4f;
          auVar67._28_4_ = 0xbdfe5d4f;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar27,auVar67);
          auVar68._8_4_ = 0x3e11e9bf;
          auVar68._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar68._12_4_ = 0x3e11e9bf;
          auVar68._16_4_ = 0x3e11e9bf;
          auVar68._20_4_ = 0x3e11e9bf;
          auVar68._24_4_ = 0x3e11e9bf;
          auVar68._28_4_ = 0x3e11e9bf;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar27,auVar68);
          auVar69._8_4_ = 0xbe2aae50;
          auVar69._0_8_ = 0xbe2aae50be2aae50;
          auVar69._12_4_ = 0xbe2aae50;
          auVar69._16_4_ = 0xbe2aae50;
          auVar69._20_4_ = 0xbe2aae50;
          auVar69._24_4_ = 0xbe2aae50;
          auVar69._28_4_ = 0xbe2aae50;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar27,auVar69);
          auVar70._8_4_ = 0x3e4cceac;
          auVar70._0_8_ = 0x3e4cceac3e4cceac;
          auVar70._12_4_ = 0x3e4cceac;
          auVar70._16_4_ = 0x3e4cceac;
          auVar70._20_4_ = 0x3e4cceac;
          auVar70._24_4_ = 0x3e4cceac;
          auVar70._28_4_ = 0x3e4cceac;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar27,auVar70);
          auVar71._8_4_ = 0xbe7ffffc;
          auVar71._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar71._12_4_ = 0xbe7ffffc;
          auVar71._16_4_ = 0xbe7ffffc;
          auVar71._20_4_ = 0xbe7ffffc;
          auVar71._24_4_ = 0xbe7ffffc;
          auVar71._28_4_ = 0xbe7ffffc;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar27,auVar71);
          auVar72._8_4_ = 0x3eaaaaaa;
          auVar72._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar72._12_4_ = 0x3eaaaaaa;
          auVar72._16_4_ = 0x3eaaaaaa;
          auVar72._20_4_ = 0x3eaaaaaa;
          auVar72._24_4_ = 0x3eaaaaaa;
          auVar72._28_4_ = 0x3eaaaaaa;
          auVar12 = vfmadd213ps_fma(ZEXT1632(auVar12),auVar27,auVar72);
          auVar56._0_4_ = auVar42._0_4_ * auVar27._0_4_ * auVar12._0_4_;
          auVar56._4_4_ = auVar42._4_4_ * auVar27._4_4_ * auVar12._4_4_;
          auVar56._8_4_ = auVar42._8_4_ * auVar27._8_4_ * auVar12._8_4_;
          auVar56._12_4_ = auVar42._12_4_ * auVar27._12_4_ * auVar12._12_4_;
          auVar56._16_4_ = auVar42._16_4_ * auVar27._16_4_ * 0.0;
          auVar56._20_4_ = auVar42._20_4_ * auVar27._20_4_ * 0.0;
          auVar56._24_4_ = auVar42._24_4_ * auVar27._24_4_ * 0.0;
          auVar56._28_4_ = 0;
          auVar16 = vcvtdq2ps_avx(auVar32);
          auVar12 = vfmadd231ps_fma(auVar56,auVar16,auVar82._0_32_);
          auVar12 = vfmsub231ps_fma(ZEXT1632(auVar12),auVar25,auVar42);
          auVar2 = vsubps_avx(ZEXT1632(auVar12),auVar27);
          auVar12 = vfnmadd231ps_fma(auVar2,auVar81._0_32_,auVar16);
          auVar16 = vcmpps_avx(ZEXT1632(auVar34),auVar73._0_32_,2);
          auVar33._8_4_ = 0x7fffffff;
          auVar33._0_8_ = 0x7fffffff7fffffff;
          auVar33._12_4_ = 0x7fffffff;
          auVar33._16_4_ = 0x7fffffff;
          auVar33._20_4_ = 0x7fffffff;
          auVar33._24_4_ = 0x7fffffff;
          auVar33._28_4_ = 0x7fffffff;
          auVar16 = vblendvps_avx(ZEXT1632(auVar12),auVar33,auVar16);
          auVar2 = vmaxps_avx(*pauVar8,auVar73._0_32_);
          auVar16 = vsubps_avx(auVar2,auVar16);
          *pauVar8 = auVar16;
          pauVar8 = pauVar8 + 1;
          iVar3 = iVar3 + 8;
          uVar4 = uVar6 & 0xfffffff8;
        } while (iVar3 < (int)uVar6);
      }
      auVar74._8_4_ = 0x3f800000;
      auVar74._0_8_ = 0x3f8000003f800000;
      auVar74._12_4_ = 0x3f800000;
      auVar75._8_4_ = 0x3f000000;
      auVar75._0_8_ = 0x3f0000003f000000;
      auVar75._12_4_ = 0x3f000000;
      auVar19._8_4_ = 0x3f318000;
      auVar19._0_8_ = 0x3f3180003f318000;
      auVar19._12_4_ = 0x3f318000;
      auVar76._8_4_ = 0xb95e8083;
      auVar76._0_8_ = 0xb95e8083b95e8083;
      auVar76._12_4_ = 0xb95e8083;
      uVar5 = uVar4 | 3;
      while ((int)uVar5 < (int)uVar6) {
        auVar13._8_4_ = 0x80000000;
        auVar13._0_8_ = 0x8000000080000000;
        auVar13._12_4_ = 0x80000000;
        auVar15 = vorps_avx(*(undefined1 (*) [16])*pauVar8,auVar13);
        auVar20._8_4_ = 0x42b0c0a5;
        auVar20._0_8_ = 0x42b0c0a542b0c0a5;
        auVar20._12_4_ = 0x42b0c0a5;
        auVar15 = vminps_avx(auVar15,auVar20);
        auVar21._8_4_ = 0xc2b0c0a5;
        auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar21._12_4_ = 0xc2b0c0a5;
        auVar34 = vmaxps_avx(auVar15,auVar21);
        auVar22._8_4_ = 0x3fb8aa3b;
        auVar22._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar22._12_4_ = 0x3fb8aa3b;
        auVar15 = vfmadd213ps_fma(auVar22,auVar34,auVar75);
        auVar28._0_4_ = (int)auVar15._0_4_;
        auVar28._4_4_ = (int)auVar15._4_4_;
        auVar28._8_4_ = (int)auVar15._8_4_;
        auVar28._12_4_ = (int)auVar15._12_4_;
        auVar12 = vcvtdq2ps_avx(auVar28);
        auVar15 = vcmpps_avx(auVar15,auVar12,1);
        auVar15 = vandps_avx(auVar74,auVar15);
        auVar15 = vsubps_avx(auVar12,auVar15);
        auVar12 = vfmsub231ps_fma(auVar34,auVar15,auVar19);
        auVar34 = vfnmsub231ps_fma(auVar12,auVar15,auVar76);
        auVar29._0_4_ = auVar34._0_4_ * auVar34._0_4_;
        auVar29._4_4_ = auVar34._4_4_ * auVar34._4_4_;
        auVar29._8_4_ = auVar34._8_4_ * auVar34._8_4_;
        auVar29._12_4_ = auVar34._12_4_ * auVar34._12_4_;
        auVar35._8_4_ = 0x39506967;
        auVar35._0_8_ = 0x3950696739506967;
        auVar35._12_4_ = 0x39506967;
        auVar43._8_4_ = 0x3ab743ce;
        auVar43._0_8_ = 0x3ab743ce3ab743ce;
        auVar43._12_4_ = 0x3ab743ce;
        auVar12 = vfmadd213ps_fma(auVar35,auVar34,auVar43);
        auVar44._8_4_ = 0x3c088908;
        auVar44._0_8_ = 0x3c0889083c088908;
        auVar44._12_4_ = 0x3c088908;
        auVar12 = vfmadd213ps_fma(auVar12,auVar34,auVar44);
        auVar45._8_4_ = 0x3d2aa9c1;
        auVar45._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar45._12_4_ = 0x3d2aa9c1;
        auVar12 = vfmadd213ps_fma(auVar12,auVar34,auVar45);
        auVar46._8_4_ = 0x3e2aaaaa;
        auVar46._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar46._12_4_ = 0x3e2aaaaa;
        auVar12 = vfmadd213ps_fma(auVar12,auVar34,auVar46);
        auVar12 = vfmadd213ps_fma(auVar12,auVar34,auVar75);
        auVar12 = vfmadd213ps_fma(auVar12,auVar29,auVar34);
        auVar30._0_4_ = auVar12._0_4_ + 1.0;
        auVar30._4_4_ = auVar12._4_4_ + 1.0;
        auVar30._8_4_ = auVar12._8_4_ + 1.0;
        auVar30._12_4_ = auVar12._12_4_ + 1.0;
        auVar14._0_4_ = (int)auVar15._0_4_;
        auVar14._4_4_ = (int)auVar15._4_4_;
        auVar14._8_4_ = (int)auVar15._8_4_;
        auVar14._12_4_ = (int)auVar15._12_4_;
        auVar15 = vpslld_avx(auVar14,0x17);
        auVar15 = vpaddd_avx(auVar74,auVar15);
        auVar14 = vfmadd213ps_fma(auVar15,auVar30,auVar74);
        auVar23._8_4_ = 0x800000;
        auVar23._0_8_ = 0x80000000800000;
        auVar23._12_4_ = 0x800000;
        auVar15 = vmaxps_avx(auVar14,auVar23);
        auVar12 = vpsrld_avx(auVar15,0x17);
        auVar36._8_4_ = 0xffffff82;
        auVar36._0_8_ = 0xffffff82ffffff82;
        auVar36._12_4_ = 0xffffff82;
        auVar12 = vpaddd_avx(auVar12,auVar36);
        auVar37._8_4_ = 0x807fffff;
        auVar37._0_8_ = 0x807fffff807fffff;
        auVar37._12_4_ = 0x807fffff;
        auVar15 = vandps_avx(auVar15,auVar37);
        auVar13 = vorps_avx(auVar75,auVar15);
        auVar34 = vcvtdq2ps_avx(auVar12);
        auVar38._8_4_ = 0x3f3504f3;
        auVar38._0_8_ = 0x3f3504f33f3504f3;
        auVar38._12_4_ = 0x3f3504f3;
        auVar12 = vcmpps_avx(auVar13,auVar38,1);
        auVar15 = vandps_avx(auVar12,auVar13);
        auVar24._0_4_ = auVar13._0_4_ + -1.0 + auVar15._0_4_;
        auVar24._4_4_ = auVar13._4_4_ + -1.0 + auVar15._4_4_;
        auVar24._8_4_ = auVar13._8_4_ + -1.0 + auVar15._8_4_;
        auVar24._12_4_ = auVar13._12_4_ + -1.0 + auVar15._12_4_;
        auVar15 = vandps_avx(auVar74,auVar12);
        auVar15 = vsubps_avx(auVar34,auVar15);
        auVar39._0_4_ = auVar24._0_4_ * auVar24._0_4_;
        auVar39._4_4_ = auVar24._4_4_ * auVar24._4_4_;
        auVar39._8_4_ = auVar24._8_4_ * auVar24._8_4_;
        auVar39._12_4_ = auVar24._12_4_ * auVar24._12_4_;
        auVar47._8_4_ = 0x3d9021bb;
        auVar47._0_8_ = 0x3d9021bb3d9021bb;
        auVar47._12_4_ = 0x3d9021bb;
        auVar57._8_4_ = 0xbdebd1b8;
        auVar57._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar57._12_4_ = 0xbdebd1b8;
        auVar12 = vfmadd213ps_fma(auVar47,auVar24,auVar57);
        auVar58._8_4_ = 0x3def251a;
        auVar58._0_8_ = 0x3def251a3def251a;
        auVar58._12_4_ = 0x3def251a;
        auVar12 = vfmadd213ps_fma(auVar12,auVar24,auVar58);
        auVar59._8_4_ = 0xbdfe5d4f;
        auVar59._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar59._12_4_ = 0xbdfe5d4f;
        auVar12 = vfmadd213ps_fma(auVar12,auVar24,auVar59);
        auVar60._8_4_ = 0x3e11e9bf;
        auVar60._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar60._12_4_ = 0x3e11e9bf;
        auVar12 = vfmadd213ps_fma(auVar12,auVar24,auVar60);
        auVar61._8_4_ = 0xbe2aae50;
        auVar61._0_8_ = 0xbe2aae50be2aae50;
        auVar61._12_4_ = 0xbe2aae50;
        auVar12 = vfmadd213ps_fma(auVar12,auVar24,auVar61);
        auVar62._8_4_ = 0x3e4cceac;
        auVar62._0_8_ = 0x3e4cceac3e4cceac;
        auVar62._12_4_ = 0x3e4cceac;
        auVar12 = vfmadd213ps_fma(auVar12,auVar24,auVar62);
        auVar63._8_4_ = 0xbe7ffffc;
        auVar63._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar63._12_4_ = 0xbe7ffffc;
        auVar12 = vfmadd213ps_fma(auVar12,auVar24,auVar63);
        auVar64._8_4_ = 0x3eaaaaaa;
        auVar64._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar64._12_4_ = 0x3eaaaaaa;
        auVar12 = vfmadd213ps_fma(auVar12,auVar24,auVar64);
        auVar48._0_4_ = auVar39._0_4_ * auVar24._0_4_ * auVar12._0_4_;
        auVar48._4_4_ = auVar39._4_4_ * auVar24._4_4_ * auVar12._4_4_;
        auVar48._8_4_ = auVar39._8_4_ * auVar24._8_4_ * auVar12._8_4_;
        auVar48._12_4_ = auVar39._12_4_ * auVar24._12_4_ * auVar12._12_4_;
        auVar12 = vfmadd231ps_fma(auVar48,auVar15,auVar76);
        auVar12 = vfmsub231ps_fma(auVar12,auVar75,auVar39);
        auVar12 = vsubps_avx(auVar12,auVar24);
        auVar12 = vfnmadd231ps_fma(auVar12,auVar19,auVar15);
        auVar15 = vcmpps_avx(auVar14,ZEXT816(0) << 0x20,2);
        auVar40._8_4_ = 0x7fffffff;
        auVar40._0_8_ = 0x7fffffff7fffffff;
        auVar40._12_4_ = 0x7fffffff;
        auVar15 = vblendvps_avx(auVar12,auVar40,auVar15);
        auVar12 = vmaxps_avx(*(undefined1 (*) [16])*pauVar8,ZEXT816(0) << 0x20);
        auVar15 = vsubps_avx(auVar12,auVar15);
        *(undefined1 (*) [16])*pauVar8 = auVar15;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        uVar5 = uVar4 + 7;
        uVar4 = uVar4 + 4;
      }
      auVar73 = ZEXT864(0) << 0x20;
      if (uVar6 - uVar4 != 0 && (int)uVar4 <= (int)uVar6) {
        lVar9 = 0;
        do {
          fVar11 = *(float *)(*pauVar8 + lVar9 * 4);
          if (fVar11 <= 0.0) {
            fVar11 = expf(fVar11);
            fVar10 = logf(fVar11 + 1.0);
          }
          else {
            fVar10 = expf(-fVar11);
            fVar10 = logf(fVar10 + 1.0);
            fVar10 = fVar10 + fVar11;
          }
          *(float *)(*pauVar8 + lVar9 * 4) = fVar10;
          lVar9 = lVar9 + 1;
          auVar73 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar78 = ZEXT3264(CONCAT428(0x3f000000,
                                       CONCAT424(0x3f000000,
                                                 CONCAT420(0x3f000000,
                                                           CONCAT416(0x3f000000,
                                                                     CONCAT412(0x3f000000,
                                                                               CONCAT48(0x3f000000,
                                                                                                                                                                                
                                                  0x3f0000003f000000)))))));
          auVar79 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                       CONCAT424(0x3fb8aa3b,
                                                 CONCAT420(0x3fb8aa3b,
                                                           CONCAT416(0x3fb8aa3b,
                                                                     CONCAT412(0x3fb8aa3b,
                                                                               CONCAT48(0x3fb8aa3b,
                                                                                                                                                                                
                                                  0x3fb8aa3b3fb8aa3b)))))));
          auVar80 = ZEXT3264(CONCAT428(0x3f800000,
                                       CONCAT424(0x3f800000,
                                                 CONCAT420(0x3f800000,
                                                           CONCAT416(0x3f800000,
                                                                     CONCAT412(0x3f800000,
                                                                               CONCAT48(0x3f800000,
                                                                                                                                                                                
                                                  0x3f8000003f800000)))))));
          auVar81 = ZEXT3264(CONCAT428(0x3f318000,
                                       CONCAT424(0x3f318000,
                                                 CONCAT420(0x3f318000,
                                                           CONCAT416(0x3f318000,
                                                                     CONCAT412(0x3f318000,
                                                                               CONCAT48(0x3f318000,
                                                                                                                                                                                
                                                  0x3f3180003f318000)))))));
          auVar82 = ZEXT3264(CONCAT428(0xb95e8083,
                                       CONCAT424(0xb95e8083,
                                                 CONCAT420(0xb95e8083,
                                                           CONCAT416(0xb95e8083,
                                                                     CONCAT412(0xb95e8083,
                                                                               CONCAT48(0xb95e8083,
                                                                                                                                                                                
                                                  0xb95e8083b95e8083)))))));
        } while (uVar6 - uVar4 != (int)lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int BNLL_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = *ptr + logf(1.f + expf(-(*ptr)));
            else
                *ptr = logf(1.f + expf(*ptr));
            ptr++;
        }
    }
    return 0;
}